

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O1

REF_STATUS
ref_split_edge_tri_conformity
          (REF_BOOL verbose,REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,
          REF_BOOL *allowed)

{
  REF_GEOM ref_geom;
  REF_CELL pRVar1;
  REF_ADJ_ITEM pRVar2;
  REF_NODE ref_node;
  uint uVar3;
  long lVar4;
  REF_INT RVar5;
  int iVar6;
  REF_DBL sign_uv_area;
  REF_DBL uv_area;
  REF_DBL uv_area0;
  REF_DBL normdev1;
  REF_DBL uv_area1;
  REF_DBL normdev0;
  REF_DBL normdev;
  REF_INT nodes [27];
  double local_100;
  REF_BOOL local_f4;
  ulong local_f0;
  REF_BOOL *local_e8;
  double local_e0;
  double local_d8;
  REF_NODE local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  local_d0 = ref_grid->node;
  ref_geom = ref_grid->geom;
  *allowed = 0;
  local_f4 = verbose;
  local_e8 = allowed;
  if (0 < ref_geom->n) {
    pRVar1 = ref_grid->cell[3];
    local_f0 = 0xffffffff;
    if (-1 < node0) {
      local_f0 = 0xffffffff;
      if (node0 < pRVar1->ref_adj->nnode) {
        local_f0 = (ulong)(uint)pRVar1->ref_adj->first[(uint)node0];
      }
    }
    if ((int)local_f0 != -1) {
      RVar5 = pRVar1->ref_adj->item[(int)local_f0].ref;
      do {
        if (0 < pRVar1->node_per) {
          iVar6 = 0;
          do {
            if (pRVar1->c2n[pRVar1->size_per * RVar5 + iVar6] == node1) {
              uVar3 = ref_cell_nodes(pRVar1,RVar5,local_a8);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x301,"ref_split_edge_tri_conformity",(ulong)uVar3,"cell nodes");
                return uVar3;
              }
              uVar3 = ref_geom_tri_norm_deviation(ref_grid,local_a8,&local_b0);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x302,"ref_split_edge_tri_conformity",(ulong)uVar3,"nd");
                return uVar3;
              }
              if (0 < pRVar1->node_per) {
                lVar4 = 0;
                do {
                  if (local_a8[lVar4] == node0) {
                    local_a8[lVar4] = new_node;
                  }
                  lVar4 = lVar4 + 1;
                } while (lVar4 < pRVar1->node_per);
              }
              uVar3 = ref_geom_tri_norm_deviation(ref_grid,local_a8,&local_b8);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x306,"ref_split_edge_tri_conformity",(ulong)uVar3,"nd0");
                return uVar3;
              }
              if (0 < pRVar1->node_per) {
                lVar4 = 0;
                do {
                  if (local_a8[lVar4] == new_node) {
                    local_a8[lVar4] = node0;
                  }
                  lVar4 = lVar4 + 1;
                } while (lVar4 < pRVar1->node_per);
              }
              if (0 < pRVar1->node_per) {
                lVar4 = 0;
                do {
                  if (local_a8[lVar4] == node1) {
                    local_a8[lVar4] = new_node;
                  }
                  lVar4 = lVar4 + 1;
                } while (lVar4 < pRVar1->node_per);
              }
              uVar3 = ref_geom_tri_norm_deviation(ref_grid,local_a8,&local_c8);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x30d,"ref_split_edge_tri_conformity",(ulong)uVar3,"nd1");
                return uVar3;
              }
              if (((local_b8 <= local_b0) && (local_b8 < ref_grid->adapt->post_min_normdev)) ||
                 ((local_c8 <= local_b0 && (local_c8 < ref_grid->adapt->post_min_normdev)))) {
                if (local_f4 != 0) {
                  printf("nd %f %f %f\n",local_b0,local_b8,local_c8);
                }
                *local_e8 = 0;
                return 0;
              }
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 < pRVar1->node_per);
        }
        pRVar2 = pRVar1->ref_adj->item;
        iVar6 = pRVar2[(int)local_f0].next;
        local_f0 = (ulong)iVar6;
        if (local_f0 == 0xffffffffffffffff) {
          RVar5 = -1;
        }
        else {
          RVar5 = pRVar2[local_f0].ref;
        }
      } while (iVar6 != -1);
    }
  }
  if ((0 < ref_geom->n) && (ref_geom->meshlink == (void *)0x0)) {
    pRVar1 = ref_grid->cell[3];
    RVar5 = -1;
    local_f0 = 0xffffffff;
    if (-1 < node0) {
      local_f0 = 0xffffffff;
      if (node0 < pRVar1->ref_adj->nnode) {
        local_f0 = (ulong)(uint)pRVar1->ref_adj->first[(uint)node0];
      }
    }
    if ((int)local_f0 != -1) {
      RVar5 = pRVar1->ref_adj->item[(int)local_f0].ref;
    }
    while ((int)local_f0 != -1) {
      if (0 < pRVar1->node_per) {
        iVar6 = 0;
        do {
          if (pRVar1->c2n[pRVar1->size_per * RVar5 + iVar6] == node1) {
            uVar3 = ref_cell_nodes(pRVar1,RVar5,local_a8);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x31d,"ref_split_edge_tri_conformity",(ulong)uVar3,"cell nodes");
              return uVar3;
            }
            uVar3 = ref_geom_uv_area(ref_geom,local_a8,&local_e0);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x31e,"ref_split_edge_tri_conformity",(ulong)uVar3,"uv area");
              return uVar3;
            }
            uVar3 = ref_geom_uv_area_sign(ref_grid,local_a8[3],&local_100);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,799,"ref_split_edge_tri_conformity",(ulong)uVar3,"sign");
              return uVar3;
            }
            local_e0 = local_100 * local_e0;
            if (0 < pRVar1->node_per) {
              lVar4 = 0;
              do {
                if (local_a8[lVar4] == node0) {
                  local_a8[lVar4] = new_node;
                }
                lVar4 = lVar4 + 1;
              } while (lVar4 < pRVar1->node_per);
            }
            uVar3 = ref_geom_uv_area(ref_geom,local_a8,&local_d8);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x324,"ref_split_edge_tri_conformity",(ulong)uVar3,"uv area");
              return uVar3;
            }
            uVar3 = ref_geom_uv_area_sign(ref_grid,local_a8[3],&local_100);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x325,"ref_split_edge_tri_conformity",(ulong)uVar3,"sign");
              return uVar3;
            }
            local_d8 = local_100 * local_d8;
            if (0 < pRVar1->node_per) {
              lVar4 = 0;
              do {
                if (local_a8[lVar4] == new_node) {
                  local_a8[lVar4] = node0;
                }
                lVar4 = lVar4 + 1;
              } while (lVar4 < pRVar1->node_per);
            }
            if (0 < pRVar1->node_per) {
              lVar4 = 0;
              do {
                if (local_a8[lVar4] == node1) {
                  local_a8[lVar4] = new_node;
                }
                lVar4 = lVar4 + 1;
              } while (lVar4 < pRVar1->node_per);
            }
            uVar3 = ref_geom_uv_area(ref_geom,local_a8,&local_c0);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x32d,"ref_split_edge_tri_conformity",(ulong)uVar3,"uv area");
              return uVar3;
            }
            uVar3 = ref_geom_uv_area_sign(ref_grid,local_a8[3],&local_100);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x32e,"ref_split_edge_tri_conformity",(ulong)uVar3,"sign");
              return uVar3;
            }
            local_c0 = local_100 * local_c0;
            if ((local_d8 <= local_d0->min_uv_area) || (local_c0 <= local_d0->min_uv_area)) {
              *local_e8 = 0;
              if (local_f4 != 0) {
                printf("area orig %e new %e %e\n",local_e0);
                ref_node = local_d0;
                ref_node_location(local_d0,node0);
                ref_node_location(ref_node,node1);
                return 0;
              }
              return 0;
            }
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 < pRVar1->node_per);
      }
      pRVar2 = pRVar1->ref_adj->item;
      local_f0 = (ulong)pRVar2[(int)local_f0].next;
      if (local_f0 == 0xffffffffffffffff) {
        RVar5 = -1;
      }
      else {
        RVar5 = pRVar2[local_f0].ref;
      }
    }
  }
  *local_e8 = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_tri_conformity(REF_BOOL verbose,
                                                 REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_INT new_node,
                                                 REF_BOOL *allowed) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell_node;
  REF_INT node;
  REF_DBL sign_uv_area, uv_area0, uv_area1, uv_area;
  REF_DBL normdev, normdev0, normdev1;

  *allowed = REF_FALSE;

  if (0 < ref_geom_n(ref_geom)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "nd");

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node0 == nodes[node]) nodes[node] = new_node;
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev0), "nd0");

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (new_node == nodes[node]) nodes[node] = node0;

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node1 == nodes[node]) nodes[node] = new_node;
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev1), "nd1");

      if ((normdev0 <= normdev &&
           normdev0 < ref_grid_adapt(ref_grid, post_min_normdev)) ||
          (normdev1 <= normdev &&
           normdev1 < ref_grid_adapt(ref_grid, post_min_normdev))) {
        if (verbose) printf("nd %f %f %f\n", normdev, normdev0, normdev1);
        *allowed = REF_FALSE;
        return REF_SUCCESS;
      }
    }
  }

  if (0 < ref_geom_n(ref_geom) && !ref_geom_meshlinked(ref_geom)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area *= sign_uv_area;

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node0 == nodes[node]) nodes[node] = new_node;
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area0), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area0 *= sign_uv_area;

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (new_node == nodes[node]) nodes[node] = node0;

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node1 == nodes[node]) nodes[node] = new_node;
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area1), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area1 *= sign_uv_area;

      if (ref_node_min_uv_area(ref_node) >= uv_area0 ||
          ref_node_min_uv_area(ref_node) >= uv_area1) {
        *allowed = REF_FALSE;
        if (verbose) {
          printf("area orig %e new %e %e\n", uv_area, uv_area0, uv_area1);
          ref_node_location(ref_node, node0);
          ref_node_location(ref_node, node1);
        }
        return REF_SUCCESS;
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}